

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  ulong uVar1;
  bool bVar2;
  cmExecutionStatus status;
  cmListFileFunction lff;
  int local_bc;
  cmMakefile *local_b8;
  string local_b0;
  undefined1 local_90 [72];
  pointer pcStack_48;
  pointer local_40;
  pointer pcStack_38;
  
  local_90._0_8_ = local_90 + 0x10;
  local_90._8_8_ = 0;
  local_90[0x10] = '\0';
  local_90._32_8_ = local_90 + 0x30;
  local_90._40_8_ = 0;
  local_90[0x30] = '\0';
  local_90._64_8_ = 0;
  pcStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  pcStack_38 = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,name,(allocator<char> *)&local_bc);
  local_b8 = (cmMakefile *)arg;
  cmCommandContext::cmCommandName::operator=((cmCommandName *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  uVar1 = 0;
  if (0 < numArgs) {
    uVar1 = (ulong)(uint)numArgs;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    local_b0._M_dataplus._M_p._0_4_ = 1;
    local_bc = 0;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&pcStack_48,args,
               (Delimiter *)&local_b0,&local_bc);
    args = args + 1;
  }
  local_b0._M_dataplus._M_p._0_4_ = 0;
  bVar2 = cmMakefile::ExecuteCommand
                    (local_b8,(cmListFileFunction *)local_90,(cmExecutionStatus *)&local_b0);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_90);
  return (uint)bVar2;
}

Assistant:

int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                           const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lff.Arguments.emplace_back(args[i], cmListFileArgument::Quoted, 0);
  }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff, status);
}